

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polar_extent.cpp
# Opt level: O3

void __thiscall
ear::PolarExtent::setup_weighting_function
          (PolarExtent *this,Vector3d *position,double width,double height)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *pCVar6;
  long lVar7;
  extent_float_t *peVar8;
  size_t i;
  double *pdVar9;
  long lVar10;
  double *__return_storage_ptr__;
  undefined4 uVar11;
  type tmp;
  Matrix3d flip;
  Matrix3d m;
  undefined1 local_188 [8];
  double dStack_180;
  CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> local_178;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  Matrix<double,_3,_3,_0,_3,_3> local_128;
  Scalar local_d8;
  Scalar local_d0;
  Scalar local_c8;
  Scalar local_c0;
  Scalar local_b8;
  Scalar local_b0;
  Scalar local_a8 [2];
  Matrix<double,_3,_3,_0,_3,_3> *local_98;
  long lStack_90;
  long local_88;
  long lStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  Vector3d local_48;
  
  dStack_180 = (double)local_188;
  dVar2 = height * 0.017453292519943295 * 0.5;
  dVar3 = width * 0.017453292519943295 * 0.5;
  uVar11 = (undefined4)((ulong)dVar3 >> 0x20);
  auVar1._8_4_ = SUB84(dVar3,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = uVar11;
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[1];
  local_48.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (position->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  __return_storage_ptr__ = (double *)&local_98;
  calcBasis((Matrix3d *)__return_storage_ptr__,&local_48);
  if (auVar1._8_8_ < dVar2) {
    unique0x10000391 = SUB84(dVar3,0);
    local_188 = (undefined1  [8])auVar1._8_8_;
    unique0x10000395 = uVar11;
    local_178.m_xpr = &local_128;
    local_178.m_row = 0;
    local_178.m_col = 1;
    local_178.m_currentBlockRows = 1;
    local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0]
         = 0.0;
    local_a8[1] = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (&local_178,local_a8 + 1);
    local_a8[0] = 1.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar6,local_a8);
    local_b0 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar6,&local_b0);
    local_b8 = 1.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar6,&local_b8);
    local_c0 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar6,&local_c0);
    local_c8 = -1.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar6,&local_c8);
    local_d0 = 0.0;
    pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_
                       (pCVar6,&local_d0);
    local_d8 = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::operator_(pCVar6,&local_d8);
    if ((local_178.m_currentBlockRows + local_178.m_row != 3) || (local_178.m_col != 3)) {
      __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ebu[P]libear/submodules/eigen/Eigen/src/Core/CommaInitializer.h"
                    ,0x7c,
                    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 3>>::finished() [MatrixType = Eigen::Matrix<double, 3, 3>]"
                   );
    }
    lVar7 = 0x10;
    do {
      dVar3 = *(double *)((long)&local_98 + lVar7);
      dVar4 = *(double *)((long)local_a8 + lVar7);
      dVar5 = *(double *)((long)local_a8 + lVar7 + 8);
      *(double *)(local_188 + lVar7) =
           dVar5 * local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[3] +
           dVar4 * local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[0] +
           dVar3 * local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[6];
      *(double *)(local_188 + lVar7 + 8) =
           dVar5 * local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[4] +
           dVar4 * local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[1] +
           dVar3 * local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[7];
      *(double *)((long)&local_178.m_xpr + lVar7) =
           local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[5] * dVar5 +
           dVar3 * local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[8] +
           local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
           array[2] * dVar4;
      lVar7 = lVar7 + 0x18;
    } while (lVar7 != 0x58);
    local_98 = local_178.m_xpr;
    lStack_90 = local_178.m_row;
    local_88 = local_178.m_col;
    lStack_80 = local_178.m_currentBlockRows;
    local_78 = local_158;
    uStack_70 = uStack_150;
    local_68 = local_148;
    uStack_60 = uStack_140;
    local_58 = local_138;
    dVar3 = dVar2;
    dVar2 = local_188;
  }
  peVar8 = (this->ctx).flippedBasis;
  lVar7 = 0;
  do {
    lVar10 = 0;
    pdVar9 = __return_storage_ptr__;
    do {
      peVar8[lVar10] = (float)*pdVar9;
      lVar10 = lVar10 + 1;
      pdVar9 = pdVar9 + 3;
    } while (lVar10 != 3);
    lVar7 = lVar7 + 1;
    peVar8 = peVar8 + 3;
    __return_storage_ptr__ = __return_storage_ptr__ + 1;
  } while (lVar7 != 3);
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       dVar2 + 3.141592653589793;
  local_178.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)0x0;
  local_178.m_row = 0x3ff921fb54442d18;
  local_178.m_col = 0x400921fb54442d18;
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       0.0;
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       1.5707963267948966;
  local_188 = (undefined1  [8])dVar2;
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] =
       interp<3,_3>(dVar3,(Matrix<double,_3,_1,_0,_3,_1> *)&local_178,
                    (Matrix<double,_3,_1,_0,_3,_1> *)&local_128);
  local_178.m_xpr = (Matrix<double,_3,_3,_0,_3,_3> *)0x0;
  local_178.m_row = 0x3fe921fb54442d18;
  local_178.m_col = 0x3ff921fb54442d18;
  local_178.m_currentBlockRows = 0x400921fb54442d18;
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] =
       local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
       [0];
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] =
       dVar3;
  local_128.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] =
       dVar3;
  dVar2 = interp<4,_4>((double)local_188,(Matrix<double,_4,_1,_0,_4,_1> *)&local_178,
                       (Matrix<double,_4,_1,_0,_4,_1> *)&local_128);
  dVar2 = dVar2 - (double)local_188;
  (this->ctx).is_circular = dVar2 < 1e-06;
  dVar3 = sin(dVar2);
  (this->ctx).right_circle_centre[0] = (float)dVar3;
  dVar3 = cos(dVar2);
  (this->ctx).right_circle_centre[1] = (float)dVar3;
  dVar3 = cos(dVar2);
  (this->ctx).circle_test[0] = -(float)dVar3;
  dVar2 = sin(dVar2);
  (this->ctx).circle_test[1] = (float)dVar2;
  setup_angle_to_weight(this,(double)local_188,(double)local_188 + 0.17453292519943295);
  return;
}

Assistant:

Eigen::MatrixXd generatePanningPositionsEven(int nRows) {
      Eigen::VectorXd elevations =
          Eigen::VectorXd::LinSpaced(nRows, -90.0, 90.0);
      Eigen::MatrixXd positions(0, 3);

      for (double el : elevations) {
        double radius = cos(radians(el));
        double perimiter = 2 * PI * radius;
        double perimiter_centre = 2 * PI;

        int nPoints = static_cast<int>(
            std::round((perimiter / perimiter_centre) * 2 * (nRows - 1)));
        if (nPoints == 0) {
          nPoints = 1;
        }
        Eigen::VectorXd azimuths =
            Eigen::VectorXd::LinSpaced(nPoints + 1, 0.0, 360.0);
        for (int i = 0; i < azimuths.size() - 1; ++i) {
          double az = azimuths(i);
          positions.conservativeResize(positions.rows() + 1, Eigen::NoChange);
          positions.row(positions.rows() - 1) = cart(az, el, 1.0);
        }
      }
      return positions;
    }